

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Expression __thiscall cnn::expr::zeroes(expr *this,ComputationGraph *g,Dim *d)

{
  pointer *pppNVar1;
  iterator __position;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  undefined8 extraout_RDX;
  Expression EVar5;
  VariableIndex local_2c;
  Node *local_28;
  
  __position._M_current =
       (g->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_2c.t = (uint)((ulong)((long)__position._M_current -
                             (long)(g->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_28 = (Node *)operator_new(0x78);
  (local_28->dim).nd = 0;
  (local_28->dim).bd = 1;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_28->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28->_vptr_Node = (_func_int **)&PTR__Node_0028baf0;
  pVVar2 = *(pointer *)(d->d + 2);
  pVVar3 = *(pointer *)(d->d + 4);
  pVVar4 = *(pointer *)(d->d + 6);
  local_28[1]._vptr_Node = *(_func_int ***)d->d;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar2;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar3;
  local_28[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar4;
  local_28[1].dim.d[0] = d->bd;
  if (__position._M_current ==
      (g->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)g,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppNVar1 = &(g->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(g,&local_2c);
  *(ComputationGraph **)this = g;
  *(uint *)(this + 8) = local_2c.t;
  EVar5._8_8_ = extraout_RDX;
  EVar5.pg = (ComputationGraph *)this;
  return EVar5;
}

Assistant:

Expression zeroes(ComputationGraph& g, const Dim& d) { return Expression(&g, g.add_function<Zeroes>(d)); }